

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O2

IAnimatedMesh * __thiscall
irr::scene::CSceneManager::getUncachedMesh
          (CSceneManager *this,IReadFile *file,path *filename,path *cachename)

{
  IMeshLoader *pIVar1;
  int iVar2;
  IAnimatedMesh *pIVar3;
  ulong uVar4;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  undefined4 extraout_var;
  
  uVar4 = (ulong)((long)(this->MeshLoaderList).m_data.
                        super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->MeshLoaderList).m_data.
                       super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  do {
    if ((int)uVar4 < 1) {
      os::Printer::log(in_XMM0_Qa);
      return (IAnimatedMesh *)0x0;
    }
    pIVar1 = (this->MeshLoaderList).m_data.
             super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1];
    iVar2 = (*pIVar1->_vptr_IMeshLoader[2])(pIVar1,filename);
    in_XMM0_Qa = extraout_XMM0_Qa;
    if ((char)iVar2 != '\0') {
      (*file->_vptr_IReadFile[1])(file,0,0);
      pIVar1 = (this->MeshLoaderList).m_data.
               super__Vector_base<irr::scene::IMeshLoader_*,_std::allocator<irr::scene::IMeshLoader_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar4 - 1];
      iVar2 = (*pIVar1->_vptr_IMeshLoader[3])(pIVar1,file);
      pIVar3 = (IAnimatedMesh *)CONCAT44(extraout_var,iVar2);
      in_XMM0_Qa = extraout_XMM0_Qa_00;
      if (pIVar3 != (IAnimatedMesh *)0x0) {
        (*this->MeshCache->_vptr_IMeshCache[2])(this->MeshCache,cachename,pIVar3);
        IReferenceCounted::drop
                  ((IReferenceCounted *)
                   ((long)&(pIVar3->super_IMesh)._vptr_IMesh +
                   (long)(pIVar3->super_IMesh)._vptr_IMesh[-3]));
        os::Printer::log(__x);
        return pIVar3;
      }
    }
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

IAnimatedMesh *CSceneManager::getUncachedMesh(io::IReadFile *file, const io::path &filename, const io::path &cachename)
{
	IAnimatedMesh *msh = 0;

	// iterate the list in reverse order so user-added loaders can override the built-in ones
	s32 count = MeshLoaderList.size();
	for (s32 i = count - 1; i >= 0; --i) {
		if (MeshLoaderList[i]->isALoadableFileExtension(filename)) {
			// reset file to avoid side effects of previous calls to createMesh
			file->seek(0);
			msh = MeshLoaderList[i]->createMesh(file);
			if (msh) {
				MeshCache->addMesh(cachename, msh);
				msh->drop();
				break;
			}
		}
	}

	if (!msh)
		os::Printer::log("Could not load mesh, file format seems to be unsupported", filename, ELL_ERROR);
	else
		os::Printer::log("Loaded mesh", filename, ELL_DEBUG);

	return msh;
}